

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringExtras.h
# Opt level: O0

string * __thiscall
llvm::detail::join_impl<std::__cxx11::string*>
          (string *__return_storage_ptr__,detail *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Begin,string *End,
          char *param_5)

{
  size_t sVar1;
  StringRef string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *I;
  size_t Len;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *End_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Begin_local;
  undefined1 auStack_20 [8];
  StringRef Separator_local;
  string *S;
  
  auStack_20 = (undefined1  [8])End;
  Separator_local.Data = param_5;
  Separator_local.Length = (size_t)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this != Begin) {
    std::distance<std::__cxx11::string*>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,Begin);
    sVar1 = StringRef::size((StringRef *)auStack_20);
    for (local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
        local_60 != Begin; local_60 = local_60 + 1) {
      std::__cxx11::string::size();
    }
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)this);
    End_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
    while (End_local = End_local + 1, End_local != Begin) {
      string.Length = sVar1;
      string.Data = Separator_local.Data;
      llvm::operator+=((llvm *)__return_storage_ptr__,(string *)auStack_20,string);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)End_local);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string join_impl(IteratorT Begin, IteratorT End,
                             StringRef Separator, std::forward_iterator_tag) {
  std::string S;
  if (Begin == End)
    return S;

  size_t Len = (std::distance(Begin, End) - 1) * Separator.size();
  for (IteratorT I = Begin; I != End; ++I)
    Len += (*Begin).size();
  S.reserve(Len);
  S += (*Begin);
  while (++Begin != End) {
    S += Separator;
    S += (*Begin);
  }
  return S;
}